

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<int,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::bin_writer<1>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<fmt::v5::char8_t>>>::int_writer<int,fmt::v5::basic_format_specs<fmt::v5::char8_t>>::bin_writer<1>>
             *this,char8_t **it)

{
  int iVar1;
  long lVar2;
  long lVar3;
  size_t __n;
  bool bVar4;
  long lVar5;
  uint uVar6;
  char8_t *pcVar7;
  char8_t *pcVar8;
  
  lVar2 = *(long *)(this + 0x10);
  pcVar8 = *it;
  if (lVar2 != 0) {
    lVar3 = *(long *)(this + 8);
    lVar5 = 0;
    do {
      pcVar8[lVar5] = *(char8_t *)(lVar3 + lVar5);
      lVar5 = lVar5 + 1;
    } while (lVar2 != lVar5);
    pcVar8 = pcVar8 + lVar5;
  }
  __n = *(size_t *)(this + 0x20);
  pcVar7 = pcVar8;
  if (__n != 0) {
    pcVar7 = pcVar8 + __n;
    memset(pcVar8,*(int *)(this + 0x18),__n);
  }
  iVar1 = *(int *)(this + 0x2c);
  pcVar8 = pcVar8 + __n + (long)iVar1;
  uVar6 = *(uint *)(this + 0x28);
  do {
    pcVar8 = pcVar8 + -1;
    *pcVar8 = (char8_t)uVar6 & 1 | 0x30;
    bVar4 = 1 < uVar6;
    uVar6 = uVar6 >> 1;
  } while (bVar4);
  *it = pcVar7 + iVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }